

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O2

int set_file_mtime_all(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  ulonglong uVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  
  uVar3 = strtoull(*argv,(char **)0x0,10);
  lVar4 = zip_get_num_entries(za,0);
  pFVar1 = _stderr;
  if (lVar4 < 0) {
    uVar5 = zip_strerror(za);
    fprintf(pFVar1,"can\'t get number of entries: %s\n",uVar5);
LAB_00105a4d:
    iVar7 = -1;
  }
  else {
    iVar7 = 0;
    for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
      iVar2 = zip_file_set_mtime(za,lVar6,uVar3,0);
      pFVar1 = _stderr;
      if (iVar2 < 0) {
        uVar5 = zip_strerror(za);
        fprintf(pFVar1,"can\'t set file mtime at index \'%lu\' to \'%lld\': %s\n",lVar6,uVar3,uVar5)
        ;
        goto LAB_00105a4d;
      }
    }
  }
  return iVar7;
}

Assistant:

static int
set_file_mtime_all(int argc, char *argv[]) {
    /* set last modification time (mtime) for all files */
    time_t mtime;
    zip_int64_t num_entries;
    zip_uint64_t idx;
    mtime = (time_t)strtoull(argv[0], NULL, 10);

    if ((num_entries = zip_get_num_entries(za, 0)) < 0) {
	fprintf(stderr, "can't get number of entries: %s\n", zip_strerror(za));
	return -1;
    }
    for (idx = 0; idx < (zip_uint64_t)num_entries; idx++) {
	if (zip_file_set_mtime(za, idx, mtime, 0) < 0) {
	    fprintf(stderr, "can't set file mtime at index '%" PRIu64 "' to '%lld': %s\n", idx, (long long)mtime, zip_strerror(za));
	    return -1;
	}
    }
    return 0;
}